

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O2

void cvui::internal::end(int theType)

{
  ulong uVar1;
  ulong uVar2;
  cvui_block_t *pcVar3;
  cvui_block_t *theBlock;
  undefined8 extraout_RAX;
  ulong uVar4;
  allocator<char> local_39;
  Size local_38;
  string local_30;
  
  pcVar3 = popBlock();
  if (pcVar3->type == theType) {
    if (gStackCount != -1) {
      theBlock = topBlock();
      uVar1._0_4_ = (pcVar3->rect).width;
      uVar1._4_4_ = (pcVar3->rect).height;
      uVar4 = CONCAT44(-(uint)((long)uVar1 < 0),-(uint)((int)(undefined4)uVar1 < 0));
      uVar2._0_4_ = (pcVar3->fill).width;
      uVar2._4_4_ = (pcVar3->fill).height;
      local_38 = (Size)(~uVar4 & uVar1 | uVar2 & uVar4);
      updateLayoutFlow(theBlock,&local_38);
    }
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "Calling wrong type of end*(). E.g. endColumn() instead of endRow(). Check if your begin*() calls are matched with their appropriate end*() calls."
             ,&local_39);
  error(4,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void end(int theType) {
		cvui_block_t& aBlock = popBlock();

		if (aBlock.type != theType) {
			error(4, "Calling wrong type of end*(). E.g. endColumn() instead of endRow(). Check if your begin*() calls are matched with their appropriate end*() calls.");
		}

		// If we still have blocks in the stack, we must update
		// the current top with the dimensions that were filled by
		// the newly popped block.

		if (!blockStackEmpty()) {
			cvui_block_t& aTop = topBlock();
			cv::Size aSize;

			// If the block has rect.width < 0 or rect.heigth < 0, it means the
			// user don't want to calculate the block's width/height. It's up to
			// us do to the math. In that case, we use the block's fill rect to find
			// out the occupied space. If the block's width/height is greater than
			// zero, then the user is very specific about the desired size. In that
			// case, we use the provided width/height, no matter what the fill rect
			// actually is.
			aSize.width = aBlock.rect.width < 0 ? aBlock.fill.width : aBlock.rect.width;
			aSize.height = aBlock.rect.height < 0 ? aBlock.fill.height : aBlock.rect.height;

			updateLayoutFlow(aTop, aSize);
		}
	}